

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerLdArrHead(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  uint32 offset;
  undefined8 in_RAX;
  Opnd *this_00;
  RegOpnd *baseOpnd;
  undefined4 *puVar4;
  IndirOpnd *newSrc;
  Lowerer *this_01;
  undefined1 auStack_28 [14];
  ValueType arrayValueType;
  
  auStack_28._0_8_ = in_RAX;
  this_00 = IR::Instr::UnlinkSrc1(instr);
  baseOpnd = IR::Opnd::AsRegOpnd(this_00);
  auStack_28._6_2_ = (baseOpnd->super_Opnd).m_valueType.field_0.bits;
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)(auStack_28 + 6));
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2c77,"(arrayValueType.IsAnyOptimizedArray())",
                       "arrayValueType.IsAnyOptimizedArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_01 = (Lowerer *)(auStack_28 + 6);
  OVar3 = ValueType::GetObjectType((ValueType *)this_01);
  if (OVar3 == ObjectWithArray) {
    baseOpnd = LoadObjectArray(this_01,baseOpnd,instr);
  }
  instr->m_dst->m_type = TyUint64;
  offset = GetArrayOffsetOfHeadSegment((ValueType)auStack_28._6_2_);
  newSrc = IR::IndirOpnd::New(baseOpnd,offset,TyUint64,instr->m_func,false);
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  LowererMD::ChangeToAssign(instr);
  return;
}

Assistant:

void Lowerer::LowerLdArrHead(IR::Instr *const instr)
{
    IR::RegOpnd *array = instr->UnlinkSrc1()->AsRegOpnd();
    const ValueType arrayValueType(array->GetValueType());
    Assert(arrayValueType.IsAnyOptimizedArray());

    if(arrayValueType.GetObjectType() == ObjectType::ObjectWithArray)
    {
        array = LoadObjectArray(array, instr);
    }

    // mov arrayHeadSegment, [array + offset(headSegment)]
    instr->GetDst()->SetType(TyMachPtr);
    instr->SetSrc1(
        IR::IndirOpnd::New(
            array,
            GetArrayOffsetOfHeadSegment(arrayValueType),
            TyMachPtr,
            instr->m_func));
    LowererMD::ChangeToAssign(instr);
}